

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

int __thiscall TinyProcessLib::Process::get_exit_status(Process *this)

{
  int *piVar1;
  bool bVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  id_type p;
  int exit_status;
  Process *this_local;
  
  if ((this->data).id < 1) {
    this_local._4_4_ = -1;
  }
  else {
    do {
      lock._M_device._0_4_ = waitpid((this->data).id,(int *)((long)&lock._M_device + 4),0);
      bVar2 = false;
      if ((__pid_t)lock._M_device < 0) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (((__pid_t)lock._M_device < 0) && (piVar1 = __errno_location(), *piVar1 == 10)) {
      this_local._4_4_ = (this->data).exit_status;
    }
    else {
      if (0xff < lock._M_device._4_4_) {
        lock._M_device._4_4_ = lock._M_device._4_4_ >> 8;
      }
      (this->data).exit_status = lock._M_device._4_4_;
      std::lock_guard<std::mutex>::lock_guard(&local_28,&this->close_mutex);
      this->closed = true;
      std::lock_guard<std::mutex>::~lock_guard(&local_28);
      close_fds(this);
      this_local._4_4_ = lock._M_device._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Process::get_exit_status() noexcept {
  if(data.id <= 0)
    return -1;

  int exit_status;
  id_type p;
  do
  {
    p = waitpid(data.id, &exit_status, 0);
  }
  while(p < 0 && errno == EINTR);

  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, return previously sampled exit status (or -1)
    return data.exit_status;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return exit_status;
}